

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O2

void __thiscall
Lib::
Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Bucket,_Lib::DefaultHash>
::clear(Map<unsigned_int,_Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::Bucket,_Lib::DefaultHash>
        *this)

{
  if (this->_entries != (Entry *)0x0) {
    array_delete<Lib::Map<unsigned_int,Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>>>::Bucket,Lib::DefaultHash>::Entry>
              (this->_entries,(long)this->_capacity);
    Lib::free(this->_entries);
  }
  *(undefined8 *)((long)&this->_entries + 4) = 0;
  *(undefined8 *)((long)&this->_afterLast + 4) = 0;
  this->_capacity = 0;
  this->_noOfEntries = 0;
  this->_entries = (Entry *)0x0;
  return;
}

Assistant:

void clear()
  {
    if (_entries) {
      array_delete(_entries, _capacity);
      DEALLOC_KNOWN(_entries,sizeof(Entry)*_capacity,"Map<>");
    }
    _capacity    = 0;
    _noOfEntries = 0;
    _entries     = nullptr;
    _afterLast   = nullptr;
    _maxEntries  = 0;
  }